

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathModValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr *ppxVar1;
  uint uVar2;
  xmlXPathObjectPtr pxVar3;
  int iVar4;
  double __y;
  double dVar5;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    iVar4 = ctxt->valueNr;
    if (0 < (long)iVar4) {
      uVar2 = iVar4 - 1;
      ctxt->valueNr = uVar2;
      ppxVar1 = ctxt->valueTab;
      if (iVar4 == 1) {
        pxVar3 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar3 = ppxVar1[(long)iVar4 + -2];
      }
      ctxt->value = pxVar3;
      pxVar3 = ppxVar1[uVar2];
      ppxVar1[uVar2] = (xmlXPathObjectPtr)0x0;
      if (pxVar3 != (xmlXPathObjectPtr)0x0) {
        __y = xmlXPathCastToNumberInternal(ctxt,pxVar3);
        xmlXPathReleaseObject(ctxt->context,pxVar3);
        pxVar3 = ctxt->value;
        if (pxVar3 != (xmlXPathObjectPtr)0x0) {
          if (pxVar3->type == XPATH_NUMBER) {
LAB_001bdee5:
            if ((__y != 0.0) || (dVar5 = xmlXPathNAN, NAN(__y))) {
              dVar5 = fmod(pxVar3->floatval,__y);
              pxVar3 = ctxt->value;
            }
            pxVar3->floatval = dVar5;
            return;
          }
          xmlXPathNumberFunction(ctxt,1);
          pxVar3 = ctxt->value;
          if ((pxVar3 != (xmlXPathObjectPtr)0x0) && (pxVar3->type == XPATH_NUMBER))
          goto LAB_001bdee5;
        }
        iVar4 = 0xb;
        goto LAB_001bdf0b;
      }
    }
  }
  iVar4 = 10;
LAB_001bdf0b:
  xmlXPathErr(ctxt,iVar4);
  return;
}

Assistant:

void
xmlXPathModValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg;
    double arg1, arg2;

    arg = xmlXPathValuePop(ctxt);
    if (arg == NULL)
	XP_ERROR(XPATH_INVALID_OPERAND);
    arg2 = xmlXPathCastToNumberInternal(ctxt, arg);
    xmlXPathReleaseObject(ctxt->context, arg);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    arg1 = ctxt->value->floatval;
    if (arg2 == 0)
	ctxt->value->floatval = xmlXPathNAN;
    else {
	ctxt->value->floatval = fmod(arg1, arg2);
    }
}